

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ComputeChannelLayout
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               int *pixel_data_size,size_t *channel_offset,int num_channels,EXRChannelInfo *channels
               )

{
  pointer puVar1;
  reference pvVar2;
  int in_ECX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  int *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_R8;
  size_t c;
  ulong local_38;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  *in_RSI = 0;
  (in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38 = 0;
  do {
    if ((ulong)(long)in_ECX <= local_38) {
      return true;
    }
    puVar1 = (in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_38)
    ;
    *pvVar2 = (value_type)puVar1;
    if (*(int *)(in_R8 + local_38 * 0x110 + 0x100) == 1) {
      *in_RSI = *in_RSI + 2;
      (in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(in_RDX->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 2);
    }
    else if (*(int *)(in_R8 + local_38 * 0x110 + 0x100) == 2) {
      *in_RSI = *in_RSI + 4;
      (in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(in_RDX->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 4);
    }
    else {
      if (*(int *)(in_R8 + local_38 * 0x110 + 0x100) != 0) {
        return false;
      }
      *in_RSI = *in_RSI + 4;
      (in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(in_RDX->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 4);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static bool ComputeChannelLayout(std::vector<size_t> *channel_offset_list,
                                 int *pixel_data_size, size_t *channel_offset,
                                 int num_channels,
                                 const EXRChannelInfo *channels) {
  channel_offset_list->resize(static_cast<size_t>(num_channels));

  (*pixel_data_size) = 0;
  (*channel_offset) = 0;

  for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
    (*channel_offset_list)[c] = (*channel_offset);
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      (*pixel_data_size) += sizeof(unsigned short);
      (*channel_offset) += sizeof(unsigned short);
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      (*pixel_data_size) += sizeof(float);
      (*channel_offset) += sizeof(float);
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      (*pixel_data_size) += sizeof(unsigned int);
      (*channel_offset) += sizeof(unsigned int);
    } else {
      // ???
      return false;
    }
  }
  return true;
}